

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultipoleAdapter.cpp
# Opt level: O3

void __thiscall
OpenMD::MultipoleAdapter::makeMultipole
          (MultipoleAdapter *this,Vector3d *dipole,Mat3x3d *quadrupole,bool isDipole,
          bool isQuadrupole)

{
  undefined8 *puVar1;
  AtomType *this_00;
  undefined8 uVar2;
  bool bVar3;
  long lVar4;
  undefined1 local_b9;
  SimpleTypeData<OpenMD::MultipoleAtypeParameters> *local_b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_b0;
  shared_ptr<OpenMD::GenericData> local_a8;
  MultipoleAtypeParameters local_90;
  
  bVar3 = AtomType::hasProperty(this->at_,(string *)MultipoleTypeID_abi_cxx11_);
  if (bVar3) {
    AtomType::removeProperty(this->at_,(string *)MultipoleTypeID_abi_cxx11_);
  }
  local_90.quadrupole.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1] =
       0.0;
  local_90.quadrupole.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] =
       0.0;
  local_90.quadrupole.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2] =
       0.0;
  local_90.quadrupole.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0] =
       0.0;
  local_90.quadrupole.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0] =
       0.0;
  local_90.quadrupole.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] =
       0.0;
  local_90.quadrupole.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] =
       0.0;
  local_90.quadrupole.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] =
       0.0;
  local_90.dipole.super_Vector<double,_3U>.data_[2] = 0.0;
  local_90.quadrupole.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
       0.0;
  local_90.dipole.super_Vector<double,_3U>.data_[0] = 0.0;
  local_90.dipole.super_Vector<double,_3U>.data_[1] = 0.0;
  if (&local_90.dipole != dipole) {
    local_90.dipole.super_Vector<double,_3U>.data_[2] = (dipole->super_Vector<double,_3U>).data_[2];
    local_90.dipole.super_Vector<double,_3U>.data_[0] = (dipole->super_Vector<double,_3U>).data_[0];
    local_90.dipole.super_Vector<double,_3U>.data_[1] = (dipole->super_Vector<double,_3U>).data_[1];
  }
  if (&local_90.quadrupole != quadrupole) {
    lVar4 = 0;
    do {
      *(undefined8 *)
       ((long)local_90.quadrupole.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
              data_[0] + lVar4 + 0x10) =
           *(undefined8 *)
            ((long)(quadrupole->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                   data_[0] + lVar4 + 0x10);
      puVar1 = (undefined8 *)
               ((long)(quadrupole->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                      data_[0] + lVar4);
      uVar2 = puVar1[1];
      *(undefined8 *)
       ((long)local_90.quadrupole.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
              data_[0] + lVar4) = *puVar1;
      *(undefined8 *)
       ((long)local_90.quadrupole.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
              data_[0] + lVar4 + 8) = uVar2;
      lVar4 = lVar4 + 0x18;
    } while (lVar4 != 0x48);
  }
  this_00 = this->at_;
  local_b8 = (SimpleTypeData<OpenMD::MultipoleAtypeParameters> *)0x0;
  local_90.isDipole = isDipole;
  local_90.isQuadrupole = isQuadrupole;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<OpenMD::SimpleTypeData<OpenMD::MultipoleAtypeParameters>,std::allocator<OpenMD::SimpleTypeData<OpenMD::MultipoleAtypeParameters>>,std::__cxx11::string_const&,OpenMD::MultipoleAtypeParameters&>
            (&_Stack_b0,&local_b8,
             (allocator<OpenMD::SimpleTypeData<OpenMD::MultipoleAtypeParameters>_> *)&local_b9,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             MultipoleTypeID_abi_cxx11_,&local_90);
  local_a8.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_b8->super_GenericData;
  local_a8.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_b0._M_pi;
  local_b8 = (SimpleTypeData<OpenMD::MultipoleAtypeParameters> *)0x0;
  _Stack_b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  AtomType::addProperty(this_00,&local_a8);
  if (local_a8.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (_Stack_b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_b0._M_pi);
  }
  return;
}

Assistant:

void MultipoleAdapter::makeMultipole(Vector3d dipole, Mat3x3d quadrupole,
                                       bool isDipole, bool isQuadrupole) {
    if (isMultipole()) { at_->removeProperty(MultipoleTypeID); }

    MultipoleAtypeParameters multipoleParam {};

    multipoleParam.dipole     = dipole;
    multipoleParam.quadrupole = quadrupole;

    multipoleParam.isDipole     = isDipole;
    multipoleParam.isQuadrupole = isQuadrupole;

    at_->addProperty(
        std::make_shared<MultipoleAtypeData>(MultipoleTypeID, multipoleParam));
  }